

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewClasses::verifyResultData
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          ,uchar *texture_data_ptr,uchar *view_data_ptr)

{
  qpTestLog *pqVar1;
  bool bVar2;
  char cVar3;
  uint n_component;
  int iVar4;
  uint uVar5;
  _format _Var6;
  deUint32 err;
  uint err_00;
  _sampler_type _Var7;
  Float<unsigned_int,_8,_23,_127,_3U> FVar8;
  undefined4 extraout_var;
  ulong uVar9;
  uchar *puVar10;
  long lVar11;
  size_t sVar12;
  TestError *this_00;
  GLuint *pGVar13;
  long lVar14;
  GLenum GVar15;
  undefined8 uVar16;
  uint *data;
  ulong uVar17;
  TextureViewTestViewClasses *pTVar18;
  ulong uVar19;
  char *pcVar20;
  ios_base *this_01;
  long **result;
  GLenum internalformat;
  uchar **ppuVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  uint reference_components_uint [4];
  int reference_components_int [4];
  uint view_components_uint [4];
  int view_components_int [4];
  float view_components_float [4];
  stringstream mipmap_data_sstream;
  float reference_components_float [4];
  uint view_component_sizes [4];
  undefined1 auStack_5b8 [4];
  GLenum local_5b4;
  TextureViewTestViewClasses *local_5b0;
  uint local_5a4;
  ulong local_5a0;
  uint local_594;
  ulong local_590;
  GLenum local_584;
  uchar *local_580;
  char *local_578;
  undefined8 local_570;
  long *local_568;
  ulong uStack_560;
  long local_558 [3];
  uint *local_540;
  uchar *local_538;
  _format local_530;
  _sampler_type local_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  long local_518;
  uint auStack_50c [8];
  float afStack_4ec [5];
  uchar *local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  undefined1 local_4c0 [8];
  undefined1 local_4b8 [8];
  undefined1 local_4b0 [104];
  ios_base local_448 [8];
  ios_base aiStack_440 [96];
  char acStack_3e0 [164];
  float fStack_33c;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  ios_base local_2c0 [260];
  char acStack_1bc [4];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [96];
  char acStack_d8 [168];
  
  local_578 = TextureViewUtilities::getInternalformatString(texture_internalformat);
  local_570 = TextureViewUtilities::getInternalformatString(view_internalformat);
  local_4d8 = view_data_ptr;
  iVar4 = bcmp(texture_data_ptr,view_data_ptr,(ulong)this->m_view_data_offset);
  local_5b0 = this;
  if (iVar4 == 0) {
    local_538 = (uchar *)0x0;
  }
  else {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    uVar9 = CONCAT44(extraout_var,iVar4);
    bVar2 = TextureViewUtilities::isInternalformatCompressed(view_internalformat);
    uVar5 = TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
    uVar19 = (ulong)uVar5;
    _Var6 = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);
    local_580 = (uchar *)CONCAT44(local_580._4_4_,_Var6);
    local_1b8 = 0;
    uStack_1b0 = 0;
    uVar17 = (ulong)view_internalformat;
    local_530 = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);
    local_5a0 = uVar9;
    local_590 = uVar19;
    local_584 = view_internalformat;
    if (bVar2) {
      if ((texture_internalformat & 0xfffffffe) == 0x8e8e) {
        uVar9 = 0;
        do {
          *(undefined4 *)((long)&local_1b8 + uVar9 * 4) = 0x20;
          uVar9 = uVar9 + 1;
        } while (uVar19 != uVar9);
        local_594 = uVar5 << 5;
      }
      else {
        uVar9 = 0;
        do {
          *(undefined4 *)((long)&local_1b8 + uVar9 * 4) = 8;
          uVar9 = uVar9 + 1;
        } while (uVar19 != uVar9);
        local_594 = uVar5 * 8;
      }
    }
    else {
      uVar17 = (ulong)view_internalformat;
      TextureViewUtilities::getComponentSizeForInternalformat
                (view_internalformat,(uint *)&local_1b8);
      local_594 = local_1b8._4_4_ + (uint)local_1b8 + (int)uStack_1b0 + uStack_1b0._4_4_;
    }
    local_5b4 = texture_internalformat;
    if (bVar2) {
      ppuVar21 = &this->m_decompressed_mipmap_data;
      if (this->m_decompressed_mipmap_data != (uchar *)0x0) {
        operator_delete__(this->m_decompressed_mipmap_data);
        *ppuVar21 = (uchar *)0x0;
      }
      puVar10 = (uchar *)operator_new__((ulong)((local_594 >> 3) * this->m_texture_width *
                                               this->m_texture_height));
      uVar9 = local_5a0;
      this->m_decompressed_mipmap_data = puVar10;
      pGVar13 = &this->m_to_id;
      if ((local_5b4 & 0xfffffffe) == 0x8e8e) {
        pGVar13 = &this->m_view_to_id;
      }
      (**(code **)(local_5a0 + 0xb8))(0xde1,*pGVar13);
      err = (**(code **)(uVar9 + 0x800))();
      glu::checkError(err,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d93);
      if (uVar5 == 3) {
        uVar16 = 0x1907;
      }
      else {
        uVar16 = 0x1908;
        if ((uVar5 != 4) && (uVar16 = 0x1903, uVar5 == 2)) {
          uVar16 = 0x8227;
        }
      }
      lVar14 = 0x1400;
      if ((int)local_580 != 3) {
        lVar14 = (ulong)((int)local_580 == 0) * 5 + 0x1401;
      }
      (**(code **)(uVar9 + 0xaa0))(0xde1,0,uVar16,lVar14,*ppuVar21);
      err_00 = (**(code **)(uVar9 + 0x800))();
      uVar17 = (ulong)err_00;
      glu::checkError(err_00,"glGetTexImage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d9e);
    }
    else {
      ppuVar21 = &this->m_mipmap_data;
    }
    local_538 = *ppuVar21;
    if (this->m_texture_width * this->m_texture_height != 0) {
      local_594 = local_594 >> 3;
      local_4c8 = (ulong)(uVar5 << 2);
      uVar9 = CONCAT71((int7)(uVar17 >> 8),1);
      local_5a0 = 0;
      local_580 = local_4d8;
      bVar2 = false;
      internalformat = local_584;
      local_4d0 = uVar19;
      do {
        local_5a4 = (uint)uVar9;
        uVar5 = local_594 * (int)local_5a0;
        local_338 = (undefined1  [8])0x0;
        uStack_330 = (_func_int **)0x0;
        local_528 = (long *)0x0;
        uStack_520 = 0;
        local_568 = (long *)0x0;
        uStack_560 = 0;
        afStack_4ec[1] = 0.0;
        afStack_4ec[2] = 0.0;
        afStack_4ec[3] = 0.0;
        afStack_4ec[4] = 0.0;
        auStack_50c[5] = 0;
        auStack_50c[6] = 0;
        stack0xfffffffffffffb10 = 0;
        auStack_50c[1] = 0;
        auStack_50c[2] = 0;
        auStack_50c[3] = 0;
        auStack_50c[4] = 0;
        pTVar18 = (TextureViewTestViewClasses *)(ulong)internalformat;
        _Var7 = TextureViewUtilities::getSamplerTypeForInternalformat(internalformat);
        uVar9 = 0;
        do {
          if (_Var7 == SAMPLER_TYPE_SIGNED_INTEGER) {
            auStack_50c[uVar9 + 5] = *(uint *)(local_580 + uVar9 * 4);
          }
          else if (_Var7 == SAMPLER_TYPE_FLOAT) {
            afStack_4ec[uVar9 + 1] = *(float *)(local_580 + uVar9 * 4);
          }
          else {
            auStack_50c[uVar9 + 1] = *(uint *)(local_580 + uVar9 * 4);
          }
          uVar9 = uVar9 + 1;
        } while (local_590 != uVar9);
        data = (uint *)(local_538 + uVar5);
        if ((int)internalformat < 0x8c3a) {
          if (internalformat == 0x8059) {
            if (_Var7 != SAMPLER_TYPE_FLOAT) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1e15);
              goto LAB_00a3b163;
            }
            uVar5 = *data;
            local_338._4_4_ = (float)(uVar5 >> 10 & 0x3ff) / 1023.0;
            local_338._0_4_ = (float)(uVar5 & 0x3ff) / 1023.0;
            uStack_330 = (_func_int **)
                         CONCAT44((float)(uVar5 >> 0x1e) / 3.0,
                                  (float)(uVar5 >> 0x14 & 0x3ff) / 1023.0);
          }
          else if (internalformat == 0x822f) {
            if (_Var7 != SAMPLER_TYPE_FLOAT) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1e35);
              goto LAB_00a3b163;
            }
            local_540 = data;
            local_4c0._0_2_ = (StorageType_conflict)*data;
            FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)local_4c0);
            local_338._0_4_ = FVar8.m_value;
            local_4c0._0_2_ = *(undefined2 *)((long)local_540 + 2);
            FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                              ((Float<unsigned_short,_5,_10,_15,_3U> *)local_4c0);
            local_338._4_4_ = FVar8.m_value;
          }
          else {
LAB_00a3a220:
            result = (long **)local_338;
            if (_Var7 != SAMPLER_TYPE_FLOAT) {
              if (_Var7 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
                result = &local_568;
              }
              else {
                result = (long **)&local_528;
              }
            }
            getComponentDataForByteAlignedInternalformat
                      (pTVar18,(uchar *)data,(uint)local_4d0,(uint *)&local_1b8,local_530,result);
          }
        }
        else if (internalformat == 0x8c3a) {
          if (_Var7 != SAMPLER_TYPE_FLOAT) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1dec);
LAB_00a3b163:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          uVar5 = *data;
          local_540 = (uint *)CONCAT44(local_540._4_4_,uVar5 >> 0x16);
          local_4c0 = (undefined1  [8])(CONCAT44(local_4c0._4_4_,uVar5) & 0xffffffff000007ff);
          FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,0u>
                            ((Float<unsigned_int,_5,_6,_15,_0U> *)local_4c0);
          local_338._0_4_ = FVar8.m_value;
          local_4c0 = (undefined1  [8])(CONCAT44(local_4c0._4_4_,uVar5 >> 0xb) & 0xffffffff000007ff)
          ;
          FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,0u>
                            ((Float<unsigned_int,_5,_6,_15,_0U> *)local_4c0);
          local_338._4_4_ = FVar8.m_value;
          local_4c0._0_4_ = local_540._0_4_;
          FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,0u>
                            ((Float<unsigned_int,_5,_5,_15,_0U> *)local_4c0);
          uStack_330 = (_func_int **)CONCAT44(uStack_330._4_4_,FVar8.m_value);
        }
        else if (internalformat == 0x8c3d) {
          uVar5 = *data;
          fVar23 = ldexpf(1.0,(uVar5 >> 0x1b) - 0x18);
          if (_Var7 != SAMPLER_TYPE_FLOAT) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1e03);
            goto LAB_00a3b163;
          }
          local_338._4_4_ = (float)(uVar5 >> 9 & 0x1ff) * fVar23;
          local_338._0_4_ = (float)(uVar5 & 0x1ff) * fVar23;
          uStack_330 = (_func_int **)
                       CONCAT44(uStack_330._4_4_,(float)(uVar5 >> 0x12 & 0x1ff) * fVar23);
        }
        else {
          if (internalformat != 0x906f) goto LAB_00a3a220;
          if (_Var7 != SAMPLER_TYPE_UNSIGNED_INTEGER) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Internal error: invalid sampler type requested",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1e27);
            goto LAB_00a3b163;
          }
          uVar5 = *data;
          local_568 = (long *)(CONCAT44(uVar5 >> 10,uVar5) & 0x3ff000003ff);
          uStack_560 = CONCAT44(uVar5 >> 0x1e,uVar5 >> 0x14) & 0xffffffff000003ff;
        }
        uVar9 = (ulong)local_5a4;
        local_52c = _Var7;
        uVar17 = 1;
        uVar19 = local_590;
        GVar15 = local_5b4;
        do {
          if (((((internalformat == 0x8c41) || (internalformat == 0x8e8d)) ||
               (internalformat == 0x8c43)) && ((uVar17 != 4 && (GVar15 != 0x8c41)))) &&
             ((GVar15 != 0x8c43 && (GVar15 != 0x8e8d)))) {
            fVar23 = (&fStack_33c)[uVar17];
            if (fVar23 <= 0.04045) {
              fVar23 = fVar23 / 12.92;
            }
            else {
              fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
              uVar19 = local_590;
              _Var7 = local_52c;
              GVar15 = local_5b4;
            }
            (&fStack_33c)[uVar17] = fVar23;
          }
          if (_Var7 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
            lVar11 = (ulong)*(uint *)((long)&local_570 + uVar17 * 4 + 4) -
                     (ulong)auStack_50c[uVar17];
            lVar14 = -lVar11;
            if (0 < lVar11) {
              lVar14 = lVar11;
            }
            if (1 < (uint)lVar14) {
              bVar2 = true;
            }
          }
          else if (_Var7 == SAMPLER_TYPE_SIGNED_INTEGER) {
            lVar11 = (long)(int)(&local_52c)[uVar17] - (long)(int)auStack_50c[uVar17 + 4];
            lVar14 = -lVar11;
            if (0 < lVar11) {
              lVar14 = lVar11;
            }
            if (1 < (int)lVar14) {
              bVar2 = true;
            }
          }
          else {
            fVar24 = (&fStack_33c)[uVar17] - afStack_4ec[uVar17];
            fVar23 = -fVar24;
            if (-fVar24 <= fVar24) {
              fVar23 = fVar24;
            }
            if (1.0 / (float)~(-1 << (acStack_1bc[uVar17 * 4] - 1U & 0x1f)) < fVar23) {
              bVar2 = true;
            }
          }
          if (bVar2) {
            if (_Var7 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
              local_4c0 = (undefined1  [8])
                          ((local_5b0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,
                         "Invalid data sampled from an unsigned integer texture view [",0x3c);
              pcVar20 = local_570;
              sVar12 = strlen(local_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,pcVar20,sVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"] created from a texture object[",0x20);
              pcVar20 = local_578;
              sVar12 = strlen(local_578);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,pcVar20,sVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"] at texel (",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"): expected:(",0xd);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,") found:(",9)
              ;
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else if (_Var7 == SAMPLER_TYPE_SIGNED_INTEGER) {
              local_4c0 = (undefined1  [8])
                          ((local_5b0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,
                         "Invalid data sampled from a signed integer texture view [",0x39);
              pcVar20 = local_570;
              sVar12 = strlen(local_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,pcVar20,sVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"] created from a texture object[",0x20);
              pcVar20 = local_578;
              sVar12 = strlen(local_578);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,pcVar20,sVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"] at texel (",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"): expected:(",0xd);
              std::ostream::operator<<((ostringstream *)local_4b8,(int)local_528);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::operator<<((ostringstream *)local_4b8,local_528._4_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::operator<<((ostringstream *)local_4b8,(int)uStack_520);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::operator<<((ostringstream *)local_4b8,uStack_520._4_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,") found:(",9)
              ;
              std::ostream::operator<<((ostringstream *)local_4b8,auStack_50c[5]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::operator<<((ostringstream *)local_4b8,auStack_50c[6]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::operator<<((ostringstream *)local_4b8,auStack_50c[7]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::operator<<((ostringstream *)local_4b8,(int)afStack_4ec[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else {
              local_4c0 = (undefined1  [8])
                          ((local_5b0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"Invalid data sampled from a texture view [",0x2a);
              pcVar20 = local_570;
              sVar12 = strlen(local_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,pcVar20,sVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"] created from a texture object[",0x20);
              pcVar20 = local_578;
              sVar12 = strlen(local_578);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,pcVar20,sVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"] at texel (",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b8,"): expected:(",0xd);
              std::ostream::_M_insert<double>((double)(float)local_338._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<double>((double)(float)local_338._4_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<double>((double)(float)uStack_330);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<double>((double)uStack_330._4_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,") found:(",9)
              ;
              std::ostream::_M_insert<double>((double)afStack_4ec[1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<double>((double)afStack_4ec[2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<double>((double)afStack_4ec[3]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,", ",2);
              std::ostream::_M_insert<double>((double)afStack_4ec[4]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
            std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x68));
            uVar9 = 0;
            uVar19 = local_590;
            internalformat = local_584;
            GVar15 = local_5b4;
          }
        } while ((!bVar2) && (bVar22 = uVar17 < uVar19, uVar17 = uVar17 + 1, bVar22));
        local_5a0 = local_5a0 + 1;
        pTVar18 = local_5b0;
      } while ((local_5a0 < local_5b0->m_texture_width * local_5b0->m_texture_height) &&
              (local_580 = local_580 + local_4c8, (uVar9 & 1) != 0));
      goto LAB_00a3aafe;
    }
  }
  bVar2 = false;
  pTVar18 = this;
LAB_00a3aafe:
  if (bVar2) {
    local_4c0 = (undefined1  [8])
                ((pTVar18->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b8,"Invalid data read from a view of internalformat ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
    pcVar20 = local_570;
    sVar12 = strlen(local_570);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar20,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b8," created from a texture of internalformat ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
    pcVar20 = local_578;
    sVar12 = strlen(local_578);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar20,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b8,". Byte streams follow:",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
    std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x68));
    std::__cxx11::stringstream::stringstream((stringstream *)local_4c0);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    pqVar1 = ((TestLog *)((long)local_4c0 + -0x18))->m_log;
    if ((acStack_3e0 + 1)[(long)pqVar1] == '\0') {
      cVar3 = std::ios::widen((char)auStack_5b8 + (char)pqVar1 + -8);
      acStack_3e0[(long)pqVar1] = cVar3;
      (acStack_3e0 + 1)[(long)pqVar1] = '\x01';
    }
    acStack_3e0[(long)pqVar1] = '0';
    lVar14 = *(long *)(local_1b8 + -0x18);
    if (acStack_d8[lVar14 + 1] == '\0') {
      cVar3 = std::ios::widen((char)auStack_5b8 + (char)lVar14);
      acStack_d8[lVar14] = cVar3;
      acStack_d8[lVar14 + 1] = '\x01';
    }
    acStack_d8[lVar14] = '0';
    *(undefined8 *)(local_4b0 + (long)((TestLog *)((long)local_4c0 + -0x18))->m_log) = 2;
    *(undefined8 *)(local_1a8 + *(long *)(local_1b8 + -0x18)) = 2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"Mip-map data: [",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Sampled view data: [",0x14);
    if (pTVar18->m_view_data_offset != 0) {
      uVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"0x",2);
        *(uint *)(*(_func_int **)(local_4b0._0_8_ + -0x18) + (long)(local_4b0 + 0x18)) =
             *(uint *)(*(_func_int **)(local_4b0._0_8_ + -0x18) + (long)(local_4b0 + 0x18)) &
             0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_4b0,(uint)local_538[uVar9]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
        *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
             *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) &
             0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_1a8,(uint)local_4d8[uVar9]);
        if (uVar9 == local_5b0->m_view_data_offset - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"]",1);
          pcVar20 = "]";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"|",1);
          pcVar20 = "|";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,1);
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_5b0->m_view_data_offset);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    pTVar18 = local_5b0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"\n",1);
    local_338 = (undefined1  [8])
                ((pTVar18->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_330);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_330,(char *)local_528,uStack_520);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_330,(char *)local_568,uStack_560);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_568 != local_558) {
      operator_delete(local_568,local_558[0] + 1);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,local_518 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_330);
    std::ios_base::~ios_base(local_2c0);
    pTVar18->m_has_test_failed = true;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4c0);
    this_01 = aiStack_440;
  }
  else {
    local_4c0 = (undefined1  [8])
                ((pTVar18->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b8,"Correct data read from a view of internalformat ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
    pcVar20 = local_570;
    sVar12 = strlen(local_570);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar20,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b8," created from a texture of internalformat ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
    pcVar20 = local_578;
    sVar12 = strlen(local_578);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar20,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
    this_01 = (ios_base *)(local_4b0 + 0x68);
  }
  std::ios_base::~ios_base(this_01);
  return;
}

Assistant:

void TextureViewTestViewClasses::verifyResultData(glw::GLenum texture_internalformat, glw::GLenum view_internalformat,
												  const unsigned char* texture_data_ptr,
												  const unsigned char* view_data_ptr)
{
	const char* texture_internalformat_string = TextureViewUtilities::getInternalformatString(texture_internalformat);
	const char* view_internalformat_string	= TextureViewUtilities::getInternalformatString(view_internalformat);

	/* For quite a number of cases, we can do a plain memcmp() applied to sampled texture/view data.
	 * If both buffers are a match, we're OK.
	 */
	bool				 has_failed  = false;
	const unsigned char* mipmap_data = DE_NULL;

	if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0)
	{
		/* Iterate over all texel components.
		 *
		 * The approach we're taking here works as follows:
		 *
		 * 1) Calculate what values should be sampled for each component using input mipmap
		 *    data.
		 * 2) Compare the reference values against the values returned when sampling the view.
		 *
		 * Note that in step 2) we're dealing with data that is returned by float/int/uint samplers,
		 * so we need to additionally process the data that we obtain by "casting" input data to
		 * the view's internalformat before we can perform the comparison.
		 *
		 * Finally, if the reference values are calculated for compressed data, we decompress it
		 * to GL_R8/GL_RG8/GL_RGB8/GL_RGBA8 internalformat first, depending on how many components
		 * the compressed internalformat supports.
		 **/
		bool				  can_continue = true;
		const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();

		/* Determine a few important properties first */
		const bool is_view_internalformat_compressed =
			TextureViewUtilities::isInternalformatCompressed(view_internalformat);
		unsigned int n_bits_per_view_texel = 0;

		const unsigned int n_view_components =
			TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
		_format texture_format = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);

		unsigned int view_component_sizes[4] = { 0 };
		_format		 view_format			 = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);

		if (!is_view_internalformat_compressed)
		{
			TextureViewUtilities::getComponentSizeForInternalformat(view_internalformat, view_component_sizes);

			n_bits_per_view_texel =
				view_component_sizes[0] + view_component_sizes[1] + view_component_sizes[2] + view_component_sizes[3];
		}
		else
		{
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				/* Each component of decompressed data will be retrieved as a 32-bit FP */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 32 /* bits per byte */;
				}

				n_bits_per_view_texel = 32 /* bits per byte */ * n_view_components;
			}
			else
			{
				/* Each component of decompressed data is stored as either signed or unsigned
				 * byte. */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 8 /* bits per byte */;
				}

				n_bits_per_view_texel = 8 /* bits per byte */ * n_view_components;
			}
		}

		/* If we need to use compressed data as reference, we need to ask GL to decompress
		 * the mipmap data using view-specific internalformat.
		 */
		mipmap_data = m_mipmap_data;

		if (is_view_internalformat_compressed)
		{
			/* Deallocate the buffer if necessary just in case */
			if (m_decompressed_mipmap_data != DE_NULL)
			{
				delete[] m_decompressed_mipmap_data;

				m_decompressed_mipmap_data = DE_NULL;
			}

			m_decompressed_mipmap_data =
				new unsigned char[m_texture_width * m_texture_height * (n_bits_per_view_texel >> 3)];

			glw::GLuint reference_tex_id = m_to_id;
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				// Encodings of SIGNED and UNSIGNED BPTC compressed texture are not compatible
				// even though they are in the same view class. Since the "view" texture contains
				// the correct encoding for the results we use that as a reference instead of the
				// incompatible parent encoded.
				reference_tex_id = m_view_to_id;
			}
			gl.bindTexture(GL_TEXTURE_2D, reference_tex_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						   (n_view_components == 4) ?
							   GL_RGBA :
							   (n_view_components == 3) ? GL_RGB : (n_view_components == 2) ? GL_RG : GL_RED,
						   (texture_format == FORMAT_SNORM) ?
							   GL_BYTE :
							   (texture_format == FORMAT_FLOAT) ? GL_FLOAT : GL_UNSIGNED_BYTE,
						   m_decompressed_mipmap_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			mipmap_data = m_decompressed_mipmap_data;
		}

		for (unsigned int n_texel = 0; n_texel < m_texture_height * m_texture_width && can_continue; ++n_texel)
		{
			/* NOTE: Vertex shader stores the sampled contents of a view texture as a
			 *       vec4/ivec4/uvec4. This means that each comonent in view_data_ptr
			 *       always takes sizeof(float) = sizeof(int) = sizeof(uint) bytes.
			 *
			 * NOTE: We cast input mip-map's data to view's internalformat, which is
			 *       why we're assuming each components takes n_bits_per_view_texel
			 *       bits instead of n_bits_per_mipmap_texel.
			 */
			const unsigned char* mipmap_texel_data =
				mipmap_data + (n_bits_per_view_texel >> 3 /* 8 bits/byte */) * n_texel;
			float		  reference_components_float[4] = { 0 };
			signed int	reference_components_int[4]   = { 0 };
			unsigned int  reference_components_uint[4]  = { 0 };
			float		  view_components_float[4]		= { 0 };
			signed int	view_components_int[4]		= { 0 };
			unsigned int  view_components_uint[4]		= { 0 };
			_sampler_type view_sampler_type =
				TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
			const unsigned char* view_texel_data = view_data_ptr + sizeof(float) * n_view_components * n_texel;

			/* Retrieve data sampled from the view */
			for (unsigned int n_component = 0; n_component < n_view_components;
				 view_texel_data += sizeof(float), /* as per comment */
				 ++n_component)
			{
				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					view_components_float[n_component] = *((float*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					view_components_int[n_component] = *((signed int*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					view_components_uint[n_component] = *((unsigned int*)view_texel_data);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized sampler type");
				}
				} /* switch (view_sampler_type) */
			}	 /* for (all components) */

			/* Compute reference data. Handle non-byte aligned internalformats manually. */
			if (view_internalformat == GL_R11F_G11F_B10F)
			{
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  red_component   = (*reference_data) & ((1 << 11) - 1);
				const unsigned int  green_component = (*reference_data >> 11) & ((1 << 11) - 1);
				const unsigned int  blue_component  = (*reference_data >> 22) & ((1 << 10) - 1);

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = Float11(red_component).asFloat();
					reference_components_float[1] = Float11(green_component).asFloat();
					reference_components_float[2] = Float10(blue_component).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB9_E5)
			{
				/* Refactored version of tcuTexture.cpp::unpackRGB999E5() */
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  exponent		= (*reference_data >> 27) & ((1 << 5) - 1);
				const unsigned int  red_component   = (*reference_data) & ((1 << 9) - 1);
				const unsigned int  green_component = (*reference_data >> 9) & ((1 << 9) - 1);
				const unsigned int  blue_component  = (*reference_data >> 18) & ((1 << 9) - 1);

				float shared_exponent =
					deFloatPow(2.0f, (float)((int)exponent - 15 /* exponent bias */ - 9 /* mantissa */));

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(red_component) * shared_exponent;
					reference_components_float[1] = float(green_component) * shared_exponent;
					reference_components_float[2] = float(blue_component) * shared_exponent;
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(((*reference_data)) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[1] = float(((*reference_data) >> 10) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[2] = float(((*reference_data) >> 20) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[3] = float(((*reference_data) >> 30) & (mask_a)) / float(mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2UI)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_UNSIGNED_INTEGER)
				{
					reference_components_uint[0] = ((*reference_data)) & (mask_rgb);
					reference_components_uint[1] = ((*reference_data) >> 10) & (mask_rgb);
					reference_components_uint[2] = ((*reference_data) >> 20) & (mask_rgb);
					reference_components_uint[3] = ((*reference_data) >> 30) & (mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RG16F)
			{
				unsigned short* reference_data = (unsigned short*)mipmap_texel_data;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = tcu::Float16(*(reference_data + 0)).asFloat();
					reference_components_float[1] = tcu::Float16(*(reference_data + 1)).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else
			{
				void* result_data = NULL;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
					result_data = reference_components_float;
					break;
				case SAMPLER_TYPE_SIGNED_INTEGER:
					result_data = reference_components_int;
					break;
				case SAMPLER_TYPE_UNSIGNED_INTEGER:
					result_data = reference_components_uint;
					break;

				default:
					TCU_FAIL("Unrecognized sampler type");
				}

				getComponentDataForByteAlignedInternalformat(mipmap_texel_data, n_view_components, view_component_sizes,
															 view_format, result_data);
			}

			for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
			{
				/* If view texture operates on sRGB color space, we need to adjust our
				 * reference value so that it is moved back into linear space.
				 */
				if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) &&
					!TextureViewUtilities::isInternalformatSRGB(texture_internalformat))
				{
					DE_ASSERT(view_sampler_type == SAMPLER_TYPE_FLOAT);

					/* Convert as per (8.14) from GL4.4 spec. Exclude alpha channel. */
					if (n_component != 3)
					{
						if (reference_components_float[n_component] <= 0.04045f)
						{
							reference_components_float[n_component] /= 12.92f;
						}
						else
						{
							reference_components_float[n_component] =
								deFloatPow((reference_components_float[n_component] + 0.055f) / 1.055f, 2.4f);
						}
					} /* if (n_component != 3) */
				}	 /* if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) ) */

				/* Compare the reference and view texture values */
				const float		   epsilon_float = 1.0f / float((1 << (view_component_sizes[n_component] - 1)) - 1);
				const signed int   epsilon_int   = 1;
				const unsigned int epsilon_uint  = 1;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					if (de::abs(reference_components_float[n_component] - view_components_float[n_component]) >
						epsilon_float)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					signed int larger_value  = 0;
					signed int smaller_value = 0;

					if (reference_components_int[n_component] > view_components_int[n_component])
					{
						larger_value  = reference_components_int[n_component];
						smaller_value = view_components_int[n_component];
					}
					else
					{
						smaller_value = reference_components_int[n_component];
						larger_value  = view_components_int[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_int)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					unsigned int larger_value  = 0;
					unsigned int smaller_value = 0;

					if (reference_components_uint[n_component] > view_components_uint[n_component])
					{
						larger_value  = reference_components_uint[n_component];
						smaller_value = view_components_uint[n_component];
					}
					else
					{
						smaller_value = reference_components_uint[n_component];
						larger_value  = view_components_uint[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_uint)
					{
						has_failed = true;
					}

					break;
				}

				default:
					TCU_FAIL("Unrecognized sampler type");
				} /* switch (view_sampler_type) */

				if (has_failed)
				{
					can_continue = false;

					switch (view_sampler_type)
					{
					case SAMPLER_TYPE_FLOAT:
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data sampled from a texture view "
																	   "["
										   << view_internalformat_string << "]"
																			" created from a texture object"
																			"["
										   << texture_internalformat_string << "]"
																			   " at texel "
																			   "("
										   << (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height)
										   << "): expected:(" << reference_components_float[0] << ", "
										   << reference_components_float[1] << ", " << reference_components_float[2]
										   << ", " << reference_components_float[3] << ") found:("
										   << view_components_float[0] << ", " << view_components_float[1] << ", "
										   << view_components_float[2] << ", " << view_components_float[3] << ")."
										   << tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_SIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from a signed integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_int[0] << ", " << reference_components_int[1] << ", "
							<< reference_components_int[2] << ", " << reference_components_int[3] << ") found:("
							<< view_components_int[0] << ", " << view_components_int[1] << ", "
							<< view_components_int[2] << ", " << view_components_int[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_UNSIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from an unsigned integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_uint[0] << ", " << reference_components_uint[1] << ", "
							<< reference_components_uint[2] << ", " << reference_components_uint[3] << ") found:("
							<< view_components_uint[0] << ", " << view_components_uint[1] << ", "
							<< view_components_uint[2] << ", " << view_components_uint[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					default:
						TCU_FAIL("Unrecognized sampler type");
					} /* switch (view_sampler_type) */

					break;
				} /* if (has_failed) */
			}	 /* for (all components) */
		}		  /* for (all texels) */
	}			  /* if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0) */

	if (has_failed)
	{
		/* Log detailed information about the failure */
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]"
						   << ". Byte streams follow:" << tcu::TestLog::EndMessage;

		/* Form texture and view data strings */
		std::stringstream mipmap_data_sstream;
		std::stringstream sampled_view_data_sstream;

		mipmap_data_sstream.fill('0');
		sampled_view_data_sstream.fill('0');

		mipmap_data_sstream.width(2);
		sampled_view_data_sstream.width(2);

		mipmap_data_sstream << "Mip-map data: [";
		sampled_view_data_sstream << "Sampled view data: [";

		for (unsigned int n = 0; n < m_view_data_offset; ++n)
		{
			mipmap_data_sstream << "0x" << std::hex << (int)(mipmap_data[n]);
			sampled_view_data_sstream << "0x" << std::hex << (int)(view_data_ptr[n]);

			if (n != (m_view_data_offset - 1))
			{
				mipmap_data_sstream << "|";
				sampled_view_data_sstream << "|";
			}
			else
			{
				mipmap_data_sstream << "]";
				sampled_view_data_sstream << "]";
			}
		}

		sampled_view_data_sstream << "\n";
		mipmap_data_sstream << "\n";

		/* Log both strings */
		m_testCtx.getLog() << tcu::TestLog::Message << mipmap_data_sstream.str() << sampled_view_data_sstream.str()
						   << tcu::TestLog::EndMessage;

		/* Do not fail the test at this point. Instead, raise a failure flag that will
		 * cause the test to fail once all iterations execute */
		m_has_test_failed = true;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Correct data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]" << tcu::TestLog::EndMessage;
	}
}